

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O0

int run_test_udp_send_hang_loop(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_idle_init(uVar2,&idle_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
            ,0x50,"0 == uv_idle_init(uv_default_loop(), &idle_handle)");
    abort();
  }
  iVar1 = uv_ip4_addr("192.0.2.3",0x23a3,&addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
            ,0x55,"0 == uv_ip4_addr(\"192.0.2.3\", TEST_PORT, &addr)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init(uVar2,&client);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
            ,0x57,"0 == uv_udp_init(uv_default_loop(), &client)");
    abort();
  }
  buf = (uv_buf_t)uv_buf_init(send_data,0x400);
  iVar1 = uv_idle_start(&idle_handle,idle_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
            ,0x5b,"0 == uv_idle_start(&idle_handle, idle_cb)");
    abort();
  }
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (loop_hang_called < 0x3e9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
            ,0x5f,"loop_hang_called > 1000");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
            ,0x61,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_send_hang_loop) {
  ASSERT(0 == uv_idle_init(uv_default_loop(), &idle_handle));

  /* 192.0.2.0/8 is "TEST-NET" and reserved for documentation.
   * Good for us, though. Since we want to have something unreachable.
   */
  ASSERT(0 == uv_ip4_addr("192.0.2.3", TEST_PORT, &addr));

  ASSERT(0 == uv_udp_init(uv_default_loop(), &client));

  buf = uv_buf_init(send_data, sizeof(send_data));

  ASSERT(0 == uv_idle_start(&idle_handle, idle_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(loop_hang_called > 1000);

  MAKE_VALGRIND_HAPPY();
  return 0;
}